

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O0

void I_SelectTimer(void)

{
  int iVar1;
  undefined1 local_28 [8];
  itimerval itv;
  
  sem_init((sem_t *)&timerWait,0,0);
  signal(0xe,I_HandleAlarm);
  itv.it_interval.tv_usec = 0;
  local_28 = (undefined1  [8])0x0;
  itv.it_value.tv_sec = 0x6f9b;
  itv.it_interval.tv_sec = 0x6f9b;
  iVar1 = setitimer(ITIMER_REAL,(itimerval *)local_28,(itimerval *)0x0);
  if (iVar1 == 0) {
    I_GetTime = I_GetTimeSignaled;
    I_FreezeTime = I_FreezeTimeSignaled;
    I_WaitForTic = I_WaitForTicSignaled;
  }
  else {
    I_GetTime = I_GetTimePolled;
    I_FreezeTime = I_FreezeTimePolled;
    I_WaitForTic = I_WaitForTicPolled;
  }
  return;
}

Assistant:

void I_SelectTimer()
{
	SEMAPHORE_INIT(timerWait, 0, 0)
#ifndef __sun
	signal(SIGALRM, I_HandleAlarm);
#else
	struct sigaction alrmaction;
	sigaction(SIGALRM, NULL, &alrmaction);
	alrmaction.sa_handler = I_HandleAlarm;
	sigaction(SIGALRM, &alrmaction, NULL);
#endif

	struct itimerval itv;
	itv.it_interval.tv_sec = itv.it_value.tv_sec = 0;
	itv.it_interval.tv_usec = itv.it_value.tv_usec = 1000000/TICRATE;

	if (setitimer(ITIMER_REAL, &itv, NULL) != 0)
	{
		I_GetTime = I_GetTimePolled;
		I_FreezeTime = I_FreezeTimePolled;
		I_WaitForTic = I_WaitForTicPolled;
	}
	else
	{
		I_GetTime = I_GetTimeSignaled;
		I_FreezeTime = I_FreezeTimeSignaled;
		I_WaitForTic = I_WaitForTicSignaled;
	}
}